

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

Track * __thiscall mkvmuxer::Segment::AddTrack(Segment *this,int32_t number)

{
  bool bVar1;
  Segment *this_00;
  Segment *local_48;
  Track *track;
  int32_t number_local;
  Segment *this_local;
  
  this_00 = (Segment *)operator_new(0x78,(nothrow_t *)&std::nothrow);
  local_48 = (Segment *)0x0;
  if (this_00 != (Segment *)0x0) {
    Track::Track((Track *)this_00,&this->seed_);
    local_48 = this_00;
  }
  if (local_48 == (Segment *)0x0) {
    this_local = (Segment *)0x0;
  }
  else {
    bVar1 = Tracks::AddTrack(&this->tracks_,(Track *)local_48,number);
    if (bVar1) {
      this_local = local_48;
    }
    else {
      if (local_48 != (Segment *)0x0) {
        (**(code **)(*(long *)local_48 + 8))();
      }
      this_local = (Segment *)0x0;
    }
  }
  return (Track *)this_local;
}

Assistant:

Track* Segment::AddTrack(int32_t number) {
  Track* const track = new (std::nothrow) Track(&seed_);  // NOLINT

  if (!track)
    return NULL;

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return NULL;
  }

  return track;
}